

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

char16_t * __thiscall icu_63::UnicodeString::getBuffer(UnicodeString *this,int32_t minCapacity)

{
  UBool UVar1;
  char16_t *pcVar2;
  int32_t minCapacity_local;
  UnicodeString *this_local;
  
  if ((-2 < minCapacity) &&
     (UVar1 = cloneArrayIfNeeded(this,minCapacity,-1,'\x01',(int32_t **)0x0,'\0'), UVar1 != '\0')) {
    (this->fUnion).fStackFields.fLengthAndFlags = (this->fUnion).fStackFields.fLengthAndFlags | 0x10
    ;
    setZeroLength(this);
    pcVar2 = getArrayStart(this);
    return pcVar2;
  }
  return (char16_t *)0x0;
}

Assistant:

char16_t *
UnicodeString::getBuffer(int32_t minCapacity) {
  if(minCapacity>=-1 && cloneArrayIfNeeded(minCapacity)) {
    fUnion.fFields.fLengthAndFlags|=kOpenGetBuffer;
    setZeroLength();
    return getArrayStart();
  } else {
    return nullptr;
  }
}